

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool DynamicProfileStorage::LoadCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int32 iVar6;
  uint uVar7;
  undefined4 *puVar8;
  Type pDVar9;
  undefined4 *unaff_RBX;
  StorageInfo *oldInfo;
  DWORD DVar10;
  undefined1 local_90 [8];
  StorageInfo newInfo;
  DWORD len;
  char16 *local_70;
  char16 *url;
  uint local_60;
  uint local_5c;
  DWORD magic;
  DWORD version;
  DynamicProfileStorageReaderWriter catalogFile;
  uint local_38;
  uint local_34;
  DWORD time;
  DWORD count;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_RBX = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x380,"(enabled)","enabled");
    if (!bVar2) goto LAB_0097e82f;
    *unaff_RBX = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_RBX = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x381,"(useCacheDir)","useCacheDir");
    if (!bVar2) goto LAB_0097e82f;
    *unaff_RBX = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *unaff_RBX = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x382,"(locked)","locked");
    if (!bVar2) goto LAB_0097e82f;
    *unaff_RBX = 0;
  }
  _magic = (char16 *)0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)&magic,catalogFilename,L"rb",false,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)&magic,&local_60,1);
    if ((((bVar2) &&
         (bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&magic,&local_5c,1), bVar2)) &&
        (bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                           ((DynamicProfileStorageReaderWriter *)&magic,&local_38,1), bVar2)) &&
       (bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)&magic,&local_34,1),
       1 < local_5c && (local_60 == 0x132b5ae && bVar2))) {
      if (2 < local_5c) {
        DisableCacheDir();
        Output::Print(L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n")
        ;
        Output::Flush();
        bVar3 = 0;
        goto LAB_0097e418;
      }
      if (useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *unaff_RBX = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                           ,0x3a8,"(useCacheDir)","useCacheDir");
        if (!bVar2) goto LAB_0097e82f;
        *unaff_RBX = 0;
      }
      if (creationTime == (ulong)local_38) {
        DVar10 = infoMap.count - infoMap.freeCount;
        if (local_34 < DVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *unaff_RBX = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ad,"(count >= start)","count >= start");
          if (!bVar2) goto LAB_0097e82f;
          *unaff_RBX = 0;
        }
        iVar6 = DynamicProfileStorageReaderWriter::Size((DynamicProfileStorageReaderWriter *)&magic)
        ;
        if (iVar6 < lastOffset) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *unaff_RBX = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3ae,"(catalogFile.Size() >= lastOffset)",
                             "catalogFile.Size() >= lastOffset");
          if (!bVar2) goto LAB_0097e82f;
          *unaff_RBX = 0;
        }
        if (local_34 == nextFileId) {
          iVar6 = DynamicProfileStorageReaderWriter::Size
                            ((DynamicProfileStorageReaderWriter *)&magic);
          bVar3 = 1;
          if (iVar6 != lastOffset) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3b1,"(catalogFile.Size() == lastOffset)",
                               "catalogFile.Size() == lastOffset");
            if (!bVar2) {
LAB_0097e82f:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar8 = 0;
          }
          goto LAB_0097e418;
        }
        bVar2 = DynamicProfileStorageReaderWriter::Seek
                          ((DynamicProfileStorageReaderWriter *)&magic,lastOffset);
        if (!bVar2) {
          DynamicProfileStorageReaderWriter::Close
                    ((DynamicProfileStorageReaderWriter *)&magic,false);
          Output::Print(L"ERROR: DynamicProfileStorage: Unable to seek to last known offset\n");
          Output::Flush();
          bVar3 = CreateCacheCatalog();
          goto LAB_0097e418;
        }
      }
      else if (creationTime == 0) {
        DVar10 = 0;
      }
      else {
        DVar10 = 0;
        Output::Print(L"WARNING: DynamicProfileStorage: Reloading full catalog\n");
        Output::Flush();
      }
      bVar3 = (byte)unaff_RBX;
      bVar2 = DVar10 < local_34;
      if (bVar2) {
        url = (char16 *)__tls_get_addr(&PTR_0155fe48);
        do {
          bVar4 = DynamicProfileStorageReaderWriter::ReadUtf8String
                            ((DynamicProfileStorageReaderWriter *)&magic,&local_70,
                             (DWORD *)((long)&newInfo.field_1 + 4));
          if (bVar4) {
            uVar7 = JsUtil::
                    BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                    ::FindEntryWithKey<char16_t*>
                              ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                                *)&infoMap,&local_70);
            pDVar9 = infoMap.entries + uVar7;
            if ((int)uVar7 < 0) {
              local_90[0] = true;
              newInfo._0_4_ = DVar10;
              JsUtil::
              BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                          *)&infoMap,&local_70,(StorageInfo *)local_90);
            }
            else {
              if ((pDVar9->
                  super_CacheHashedEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  ).super_KeyValueEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
                  super_ValueEntry<DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>_>
                  .
                  super_KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>
                  .value.isFileStorage == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                url[0] = L'\x01';
                url[1] = L'\0';
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x3d8,"(oldInfo->isFileStorage)","oldInfo->isFileStorage");
                if (!bVar5) goto LAB_0097e82f;
                url[0] = L'\0';
                url[1] = L'\0';
              }
              (pDVar9->
              super_CacheHashedEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).super_KeyValueEntry<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
              super_ValueEntry<DynamicProfileStorage::StorageInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>_>
              .super_KeyValueEntryDataLayout2<const_char16_t_*,_DynamicProfileStorage::StorageInfo>.
              value.field_1.fileId = DVar10;
            }
          }
          else {
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase);
            if (bVar5) {
              Output::Print(
                           L"TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: \'%s\'\n"
                           );
              Output::Flush();
            }
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)&magic,false);
            bVar5 = CreateCacheCatalog();
            unaff_RBX = (undefined4 *)(ulong)bVar5;
          }
          bVar3 = (byte)unaff_RBX;
          if (!bVar4) break;
          DVar10 = DVar10 + 1;
          bVar2 = DVar10 < local_34;
        } while (bVar2);
      }
      if (!bVar2) {
        if ((creationTime == 0) &&
           (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase), bVar2
           )) {
          Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog loaded: \'%s\'\n",
                        catalogFilename);
          Output::Flush();
        }
        nextFileId = local_34;
        creationTime = (TimeType)local_38;
        lastOffset = DynamicProfileStorageReaderWriter::Size
                               ((DynamicProfileStorageReaderWriter *)&magic);
        bVar3 = 1;
      }
      goto LAB_0097e418;
    }
    DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)&magic,false);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase);
    if (bVar2) {
      Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                    ,catalogFilename);
      Output::Flush();
    }
  }
  bVar3 = CreateCacheCatalog();
LAB_0097e418:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&magic);
  return (bool)(bVar3 & 1);
}

Assistant:

bool DynamicProfileStorage::LoadCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DynamicProfileStorageReaderWriter catalogFile;
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    if (!catalogFile.Init(catalogFilename, _u("rb"), false))
    {
        return CreateCacheCatalog();
    }
    if (!catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n"));
        Output::Flush();
        return false;
    }

    DWORD start = 0;

    AssertOrFailFast(useCacheDir);
    if (time == creationTime)
    {
        // We can reuse existing data
        start = infoMap.Count();
        AssertOrFailFast(count >= start);
        AssertOrFailFast(catalogFile.Size() >= lastOffset);
        if (count == nextFileId)
        {
            AssertOrFailFast(catalogFile.Size() == lastOffset);
            return true;
        }

        if (!catalogFile.Seek(lastOffset))
        {
            catalogFile.Close();
            Output::Print(_u("ERROR: DynamicProfileStorage: Unable to seek to last known offset\n"));
            Output::Flush();
            return CreateCacheCatalog();
        }
    }
    else if (creationTime != 0)
    {
        Output::Print(_u("WARNING: DynamicProfileStorage: Reloading full catalog\n"));
        Output::Flush();
    }

    for (DWORD i = start; i < count; i++)
    {
        DWORD len;
        char16 * url;
        if (!catalogFile.ReadUtf8String(&url, &len))
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: '%s'\n"), catalogFilename);
                Output::Flush();
            }
#endif
            // REVIEW: the file is corrupted, should we not flush the cache totally?
            catalogFile.Close();
            return CreateCacheCatalog();
        }

        StorageInfo * oldInfo;
        if (infoMap.TryGetReference(url, &oldInfo))
        {
            AssertOrFailFast(oldInfo->isFileStorage);
            oldInfo->fileId = i;
        }
        else
        {
            StorageInfo newInfo;
            newInfo.isFileStorage = true;
            newInfo.fileId = i;
            infoMap.Add(url, newInfo);
        }
    }

#if DBG_DUMP
    if (creationTime == 0 && DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog loaded: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif

    nextFileId = count;
    creationTime = time;
    lastOffset = catalogFile.Size();
    return true;
}